

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_rb_available_read(ma_rb *pRB)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  
  if (pRB != (ma_rb *)0x0) {
    mVar2 = (pRB->encodedWriteOffset & 0x7fffffff) - (pRB->encodedReadOffset & 0x7fffffff);
    if ((int)(pRB->encodedWriteOffset ^ pRB->encodedReadOffset) < 0) {
      mVar2 = mVar2 + pRB->subbufferSizeInBytes;
    }
    mVar1 = 0;
    if (0 < (int)mVar2) {
      mVar1 = mVar2;
    }
    return mVar1;
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_rb_available_read(ma_rb* pRB)
{
    ma_int32 dist;

    if (pRB == NULL) {
        return 0;
    }

    dist = ma_rb_pointer_distance(pRB);
    if (dist < 0) {
        return 0;
    }

    return dist;
}